

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O1

void __thiscall WebServer::handleConnection(WebServer *this)

{
  TimerManager *this_00;
  int iVar1;
  mapped_type *pmVar2;
  undefined1 in_RCX [8];
  sockaddr *extraout_RDX;
  sockaddr *__addr;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  sockaddr *extraout_RDX_04;
  sockaddr *extraout_RDX_05;
  shared_ptr<HttpData> httpData;
  shared_ptr<ClientSocket> clientSocket_ptr;
  shared_ptr<TimerNode> timerNode;
  epoll_event event;
  CbTask cbtask;
  HttpData *local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  ClientSocket *local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  undefined1 local_b0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  _Head_base<0UL,_WebServer_*,_false> local_a0;
  shared_ptr<TimerNode> local_98;
  shared_ptr<ClientSocket> local_88;
  __uint32_t local_74;
  int local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  code *local_58;
  undefined8 uStack_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  local_c0 = (ClientSocket *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ClientSocket,std::allocator<ClientSocket>>
            (&local_b8,&local_c0,(_Sp_alloc_shared_tag<std::allocator<ClientSocket>_>)&local_68);
  __addr = extraout_RDX;
  while( true ) {
    iVar1 = ServerSocket::accept(&this->serverSocket_,(int)local_c0,__addr,(socklen_t *)in_RCX);
    if (iVar1 < 1) break;
    setNonBlocking(local_c0->fd_);
    std::__shared_ptr<HttpData,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<std::allocator<HttpData>>
              ((__shared_ptr<HttpData,(__gnu_cxx::_Lock_policy)2> *)&local_d0,
               (allocator<HttpData> *)&local_68);
    local_88.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_c0;
    local_88.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_b8._M_pi;
    if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_b8._M_pi)->_M_use_count = (local_b8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_b8._M_pi)->_M_use_count = (local_b8._M_pi)->_M_use_count + 1;
      }
    }
    HttpData::setClientSocket(local_d0,&local_88);
    if (local_88.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    local_48 = (element_type *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58 = (code *)0x0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_b0 = (undefined1  [8])cbfunc;
    local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a0._M_head_impl = this;
    std::function<void(std::shared_ptr<void>)>::operator=
              ((function<void(std::shared_ptr<void>)> *)&local_68,
               (_Bind<void_(WebServer::*(WebServer_*,_std::_Placeholder<1>))(std::shared_ptr<void>)>
                *)local_b0);
    local_48 = local_d0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(a_Stack_40,&local_c8);
    local_b0 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<TimerNode,std::allocator<TimerNode>,unsigned_long&,CbTask&>
              (&local_a8,(TimerNode **)local_b0,(allocator<TimerNode> *)&local_74,
               &TimerNode::DEFAULT_INTERVAL_SEC,(CbTask *)&local_68);
    pmVar2 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::shared_ptr<HttpData>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<HttpData>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<HttpData>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<HttpData>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->httpDataMap_,
                          &((local_d0->sharedPtr_clientSocket).
                            super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           fd_);
    (pmVar2->super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_d0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar2->super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               &local_c8);
    local_74 = Epoll::DEFAULT_EVENT;
    local_70 = local_c0->fd_;
    iVar1 = Epoll::modFd(this->epoll_,1,local_c0->fd_,(epoll_event *)&local_74);
    if (iVar1 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"add listen socket success",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
    }
    this_00 = this->timerManager;
    local_98.super___shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0;
    local_98.super___shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_a8._M_pi;
    in_RCX = local_b0;
    if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      in_RCX = (undefined1  [8])&__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a8._M_pi)->_M_use_count = (local_a8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a8._M_pi)->_M_use_count = (local_a8._M_pi)->_M_use_count + 1;
      }
    }
    TimerManager::addTimerNode(this_00,&local_98);
    __addr = extraout_RDX_00;
    if (local_98.super___shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.super___shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      __addr = extraout_RDX_01;
    }
    if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
      __addr = extraout_RDX_02;
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
      __addr = extraout_RDX_03;
    }
    if (local_58 != (code *)0x0) {
      (*local_58)((allocator<HttpData> *)&local_68,(allocator<HttpData> *)&local_68,3);
      __addr = extraout_RDX_04;
    }
    if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
      __addr = extraout_RDX_05;
    }
  }
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
  }
  return;
}

Assistant:

void WebServer::handleConnection()
{
    /*因为ET模式，记得把socket设置为非阻塞的*/
    std::shared_ptr<ClientSocket> clientSocket_ptr = std::make_shared<ClientSocket>();
    while (serverSocket_.accept(*clientSocket_ptr) > 0)
    {
        /* 设置为非阻塞 */
        setNonBlocking(clientSocket_ptr->fd_); 

        /* 初始化httpData */
        std::shared_ptr<HttpData> httpData = std::make_shared<HttpData>();
        httpData->setClientSocket(clientSocket_ptr);
        /* 初始化timerNode */
        CbTask cbtask;
        cbtask.function = std::bind(&WebServer::cbfunc, this, std::placeholders::_1);
        cbtask.arg = httpData;
        std::shared_ptr<TimerNode> timerNode = std::make_shared<TimerNode>(TimerNode::DEFAULT_INTERVAL_SEC,cbtask);

        /* 将httpData 保存到Map中 */
        this->httpDataMap_[httpData->sharedPtr_clientSocket->fd_] = httpData;

        /* 添加对应的监听事件 */
        struct epoll_event event;
        event.events = Epoll::DEFAULT_EVENT;
        event.data.fd = clientSocket_ptr->fd_;

        if (epoll_->modFd(EPOLL_CTL_ADD, clientSocket_ptr->fd_, &event))
        {

            // std::cout << "add listen socket " << clientSocket_ptr->fd_ << std::endl;
        }
        else
        {
            std::cout << "add listen socket success" << std::endl;
        }

        /* 添加定时器 */
        timerManager->addTimerNode(timerNode);
    }
}